

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O2

size_type __thiscall
std::experimental::detail::
dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
::operator()(dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
             *this,dimensions<3UL,_18446744073709551615UL,_18446744073709551615UL> d0)

{
  dimensions<3UL,_18446744073709551615UL,_18446744073709551615UL> d0_00;
  value_type vVar1;
  size_type sVar2;
  dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,3ul>
  local_21;
  dimensions<3UL,_18446744073709551615UL,_18446744073709551615UL> d0_local;
  
  d0_local.dynamic_dims_._M_elems[1] = d0.dynamic_dims_._M_elems[1];
  d0_local.dynamic_dims_._M_elems[0] = d0.dynamic_dims_._M_elems[0];
  vVar1 = dimensions<3UL,_18446744073709551615UL,_18446744073709551615UL>::operator[]<unsigned_long>
                    (&d0_local,1);
  d0_00.dynamic_dims_._M_elems[1] = d0_local.dynamic_dims_._M_elems[1];
  d0_00.dynamic_dims_._M_elems[0] = d0_local.dynamic_dims_._M_elems[0];
  sVar2 = dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,3ul>
          ::operator()(&local_21,d0_00);
  return sVar2 * vVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
        ) const noexcept
    {
        static_assert(
            std::rank<dimensions<Dims0...> >::value == Size 
          , "Size not equal to rank of argument"
        );
        return Reduction()(
            Op()(d0[Idx])
          , dims_unary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0))
        );
    }